

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_fp.c
# Opt level: O1

int fe(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  
  pdVar2 = *(double **)((long)y->content + 0x10);
  dVar3 = *pdVar2;
  dVar4 = pdVar2[1];
  dVar1 = pdVar2[2];
  pdVar2 = *(double **)((long)ydot->content + 0x10);
  *pdVar2 = dVar3 * dVar4 * dVar3 + (*user_data - (dVar1 + 1.0) * dVar3);
  pdVar2[1] = dVar3 * dVar1 + -(dVar4 * dVar3) * dVar3;
  pdVar2[2] = -dVar1 * dVar3;
  return 0;
}

Assistant:

static int fe(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype* rdata = (sunrealtype*)user_data; /* cast user_data to sunrealtype */
  sunrealtype a = rdata[0];                     /* access data entries */
  sunrealtype u = NV_Ith_S(y, 0);               /* access solution values */
  sunrealtype v = NV_Ith_S(y, 1);
  sunrealtype w = NV_Ith_S(y, 2);

  /* fill in the RHS function */
  NV_Ith_S(ydot, 0) = a - (w + 1.0) * u + v * u * u;
  NV_Ith_S(ydot, 1) = w * u - v * u * u;
  NV_Ith_S(ydot, 2) = -w * u;

  return 0; /* Return with success */
}